

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

void curl_mime_free(curl_mime *mime)

{
  curl_mimepart *part;
  
  if (mime != (curl_mime *)0x0) {
    mime_subparts_unbind(mime);
    while (part = mime->firstpart, part != (curl_mimepart *)0x0) {
      mime->firstpart = part->nextpart;
      Curl_mime_cleanpart(part);
      (*Curl_cfree)(part);
    }
    (*Curl_cfree)(mime);
    return;
  }
  return;
}

Assistant:

void curl_mime_free(curl_mime *mime)
{
  curl_mimepart *part;

  if(mime) {
    mime_subparts_unbind(mime);  /* Be sure it is not referenced anymore. */
    while(mime->firstpart) {
      part = mime->firstpart;
      mime->firstpart = part->nextpart;
      Curl_mime_cleanpart(part);
      free(part);
    }
    free(mime);
  }
}